

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

int custom_2(uint arg1,char *argx,uint count,char *retBuf,uint32_t retMax)

{
  int sent;
  gpioExtent_t ext [1];
  
  ext[0].size = (size_t)count;
  ext[0].ptr = argx;
  sent = pigpio_command_ext(gPigCommand,0x58,arg1,retMax,count,1,ext,0);
  if (0 < sent) {
    sent = recvMax(retBuf,retMax,sent);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return sent;
}

Assistant:

int custom_2(unsigned arg1, char *argx, unsigned count,
             char *retBuf, uint32_t retMax)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=arg1
   p2=retMax
   p3=count
   ## extension ##
   char argx[count]
   */

   ext[0].size = count;
   ext[0].ptr = argx;

   bytes = pigpio_command_ext
      (gPigCommand, PI_CMD_CF2, arg1, retMax, count, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(retBuf, retMax, bytes);
   }

   pthread_mutex_unlock(&command_mutex);

   return bytes;
}